

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O3

UniValue *
wallet::ProcessImportLegacy
          (UniValue *__return_storage_ptr__,ImportData *import_data,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *script_pub_keys,
          bool *have_solving_data,UniValue *data,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  unique_ptr<CScript,_std::default_delete<CScript>_> *this;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_header *p_Var5;
  VType VVar6;
  pointer pcVar7;
  _Head_base<0UL,_CScript_*,_false> _Var8;
  CScript *pCVar9;
  undefined8 uVar10;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_00;
  iterator __position;
  bool bVar11;
  char cVar12;
  UniValue *pUVar13;
  string *psVar14;
  string *psVar15;
  undefined7 extraout_var;
  optional<OutputType> oVar16;
  _Head_base<0UL,_CScript_*,_false> _Var17;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  const_iterator cVar18;
  const_iterator cVar19;
  _Base_ptr p_Var20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  _Base_ptr p_Var22;
  const_iterator cVar23;
  iterator iVar24;
  iterator iVar25;
  byte bVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  _Self __tmp;
  iterator __position_00;
  ScriptContext script_ctx;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *psVar29;
  _Self __tmp_1;
  pointer __p;
  size_t sVar30;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  Span<const_unsigned_char> s;
  string_view str;
  string_view str_00;
  string_view str_01;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>,_std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>_>
  pVar31;
  map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_> *__range3;
  bool internal;
  CTxDestination dest;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vData;
  CKeyID id;
  size_t i_4;
  size_t i_3;
  size_t i;
  undefined8 in_stack_fffffffffffffae8;
  ImportData *this_01;
  undefined4 uVar32;
  undefined4 in_stack_fffffffffffffb14;
  map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_> *this_02;
  undefined7 in_stack_fffffffffffffb20;
  _Alloc_hider in_stack_fffffffffffffb28;
  size_type in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  UniValue local_4b8;
  UniValue local_460;
  UniValue local_408;
  UniValue local_3b0;
  undefined1 local_358 [16];
  undefined1 local_348 [48];
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
  _Stack_318;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  _Stack_2e8;
  UniValue local_2b0;
  UniValue local_258;
  UniValue local_200;
  undefined1 local_1a8 [8];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  undefined1 local_138 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<UniValue,_std::allocator<UniValue>_> vStack_108;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<UniValue,_std::allocator<UniValue>_> vStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  UniValue *local_38;
  
  local_38 = *(UniValue **)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358._0_8_ = local_348;
  psVar29 = script_pub_keys;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"scriptPubKey","");
  pUVar13 = ::UniValue::operator[](data,(string *)local_358);
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
  }
  VVar6 = pUVar13->typ;
  if (VVar6 != VSTR) {
    if (VVar6 == VOBJ) {
      local_358._0_8_ = local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"address","");
      bVar11 = ::UniValue::findKey(pUVar13,(string *)local_358,(size_t *)local_f0);
      if ((undefined1 *)local_358._0_8_ != local_348) {
        operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
      }
      if (bVar11) {
        local_358._0_8_ = local_348;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"address","");
        pUVar13 = ::UniValue::operator[](pUVar13,(string *)local_358);
        psVar14 = ::UniValue::get_str_abi_cxx11_(pUVar13);
        if ((undefined1 *)local_358._0_8_ != local_348) {
          operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
        }
        goto LAB_00b934c6;
      }
    }
    pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
    local_358._0_8_ = local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "scriptPubKey must be string with script or JSON with address string","");
    JSONRPCError(pUVar13,-8,(string *)local_358);
    if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
    goto LAB_00b95ae6;
  }
  psVar14 = ::UniValue::get_str_abi_cxx11_(pUVar13);
LAB_00b934c6:
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"redeemscript","");
  bVar11 = ::UniValue::findKey(data,(string *)local_358,(size_t *)local_f0);
  if (bVar11) {
    local_f0 = (undefined1  [8])local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"redeemscript","");
    pUVar13 = ::UniValue::operator[](data,(string *)local_f0);
    psVar15 = ::UniValue::get_str_abi_cxx11_(pUVar13);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    pcVar7 = (psVar15->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar7,pcVar7 + psVar15->_M_string_length);
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,local_e0._0_8_ + 1);
    }
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  }
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
  }
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"witnessscript","");
  bVar11 = ::UniValue::findKey(data,(string *)local_358,(size_t *)local_f0);
  if (bVar11) {
    local_f0 = (undefined1  [8])local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"witnessscript","");
    pUVar13 = ::UniValue::operator[](data,(string *)local_f0);
    psVar15 = ::UniValue::get_str_abi_cxx11_(pUVar13);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pcVar7 = (psVar15->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar7,pcVar7 + psVar15->_M_string_length);
    if (local_f0 != (undefined1  [8])local_e0) {
      operator_delete((void *)local_f0,local_e0._0_8_ + 1);
    }
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  }
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
  }
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"pubkeys","");
  bVar11 = ::UniValue::findKey(data,(string *)local_358,(size_t *)local_148);
  if (bVar11) {
    local_148 = (undefined1  [8])local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"pubkeys","");
    pUVar13 = ::UniValue::operator[](data,(string *)local_148);
    pUVar13 = ::UniValue::get_array(pUVar13);
    local_f0._0_4_ = pUVar13->typ;
    local_e8._M_p = local_e0 + 8;
    pcVar7 = (pUVar13->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar7,pcVar7 + (pUVar13->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c8,&pUVar13->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector(&vStack_b0,&pUVar13->values);
    if (local_148 != (undefined1  [8])local_138) {
      operator_delete((void *)local_148,local_138._0_8_ + 1);
    }
  }
  else {
    local_e8._M_p = local_e0 + 8;
    local_e0._0_8_ = 0;
    local_e0[8] = '\0';
    local_f0 = (undefined1  [8])((ulong)local_f0 & 0xffffffff00000000);
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
  }
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"keys","");
  bVar11 = ::UniValue::findKey(data,(string *)local_358,(size_t *)local_168);
  if (bVar11) {
    local_168._0_8_ = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"keys","");
    pUVar13 = ::UniValue::operator[](data,(string *)local_168);
    pUVar13 = ::UniValue::get_array(pUVar13);
    local_148._0_4_ = pUVar13->typ;
    local_140._M_p = local_138 + 8;
    pcVar7 = (pUVar13->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar7,pcVar7 + (pUVar13->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_120,&pUVar13->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector(&vStack_108,&pUVar13->values);
    if ((CScript *)local_168._0_8_ != (CScript *)local_158) {
      operator_delete((void *)local_168._0_8_,CONCAT44(local_158._4_4_,local_158._0_4_) + 1);
    }
  }
  else {
    local_140._M_p = local_138 + 8;
    local_138._0_8_ = 0;
    local_138[8] = '\0';
    local_148 = (undefined1  [8])((ulong)local_148 & 0xffffffff00000000);
    local_120.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_120.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_120.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
  }
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"internal","");
  bVar11 = ::UniValue::findKey(data,(string *)local_358,(size_t *)local_168);
  if (bVar11) {
    local_168._0_8_ = (CScript *)local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"internal","");
    pUVar13 = ::UniValue::operator[](data,(string *)local_168);
    cVar12 = ::UniValue::get_bool(pUVar13);
    if ((CScript *)local_168._0_8_ != (CScript *)local_158) {
      operator_delete((void *)local_168._0_8_,CONCAT44(local_158._4_4_,local_158._0_4_) + 1);
    }
  }
  else {
    cVar12 = false;
  }
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
  }
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"watchonly","");
  bVar11 = ::UniValue::findKey(data,(string *)local_358,(size_t *)local_168);
  if (bVar11) {
    local_168._0_8_ = (CScript *)local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"watchonly","");
    pUVar13 = ::UniValue::operator[](data,(string *)local_168);
    bVar11 = ::UniValue::get_bool(pUVar13);
    uVar32 = (undefined4)CONCAT71(extraout_var,bVar11);
    if ((CScript *)local_168._0_8_ != (CScript *)local_158) {
      operator_delete((void *)local_168._0_8_,CONCAT44(local_158._4_4_,local_158._0_4_) + 1);
    }
  }
  else {
    uVar32 = 0;
  }
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
  }
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"range","");
  bVar11 = ::UniValue::findKey(data,(string *)local_358,(size_t *)local_168);
  if ((CScript *)local_358._0_8_ != (CScript *)local_348) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
  }
  if (bVar11) {
    pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
    local_358._0_8_ = local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"Range should not be specified for a non-descriptor import","");
    JSONRPCError(pUVar13,-8,(string *)local_358);
    if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
    goto LAB_00b95ae6;
  }
  local_158._0_4_ = 0;
  local_158._4_4_ = 0;
  local_158._8_4_ = _S_red;
  local_158._12_4_ = 0;
  local_168._0_8_ = (CScript *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  if (VVar6 == VSTR) {
    str._M_str = (psVar14->_M_dataplus)._M_p;
    str._M_len = psVar14->_M_string_length;
    bVar11 = IsHex(str);
    if (!bVar11) {
      pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "Invalid scriptPubKey \"",psVar14);
      pbVar21 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188,"\"");
      local_358._0_8_ = (pbVar21->_M_dataplus)._M_p;
      paVar27 = &pbVar21->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar21->field_2 + 8);
        local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_348._8_4_ = (undefined4)uVar10;
        local_348._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_358._0_8_ = (CScript *)local_348;
      }
      else {
        local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_358._8_4_ = (undefined4)pbVar21->_M_string_length;
      local_358._12_4_ = (undefined4)(pbVar21->_M_string_length >> 0x20);
      (pbVar21->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar21->_M_string_length = 0;
      (pbVar21->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar13,-5,(string *)local_358);
      if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00b95ae6;
    }
    hex_str._M_str = (psVar14->_M_dataplus)._M_p;
    hex_str._M_len = psVar14->_M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,hex_str);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_358,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_1a8,local_1a0);
    if (0x1c < (uint)local_158._12_4_) {
      free((void *)local_168._0_8_);
    }
    local_158._0_4_ = local_348._0_4_;
    local_158._4_4_ = local_348._4_4_;
    local_158._8_4_ = local_348._8_4_;
    local_168._0_8_ = local_358._0_8_;
    local_168._8_4_ = local_358._8_4_;
    local_168._12_4_ = local_358._12_4_;
    local_158._12_4_ = local_348._12_4_;
    local_348._0_4_ = 0;
    local_348._4_4_ = 0;
    local_348._8_4_ = _S_red;
    local_348._12_4_ = 0;
    local_358._0_8_ = (CScript *)0x0;
    local_358._8_4_ = 0;
    local_358._12_4_ = 0;
    _Stack_318._M_impl.super__Rb_tree_header._M_header._0_8_ =
         _Stack_318._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    bVar11 = ExtractDestination((CScript *)local_168,(CTxDestination *)local_358);
    if ((!bVar11) && ((bool)cVar12 == false)) {
      pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
      local_188._0_8_ = local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,
                 "Internal must be set to true for nonstandard scriptPubKey imports.","");
      JSONRPCError(pUVar13,-8,(string *)local_188);
      if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00b95ae6;
    }
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_358);
    if (local_1a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity - (long)local_1a8);
    }
  }
  else {
    DecodeDestination((CTxDestination *)local_358,psVar14);
    bVar11 = IsValidDestination((CTxDestination *)local_358);
    if (!bVar11) {
      pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Invalid address \"",psVar14);
      pbVar21 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"\"");
      local_188._0_8_ = (pbVar21->_M_dataplus)._M_p;
      paVar27 = &pbVar21->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar21->field_2 + 8);
        local_178._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_178._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_178._8_4_ = (undefined4)uVar10;
        local_178._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_188._0_8_ = (CScript *)local_178;
      }
      else {
        local_178._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_178._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_188._8_4_ = (undefined4)pbVar21->_M_string_length;
      local_188._12_4_ = (undefined4)(pbVar21->_M_string_length >> 0x20);
      (pbVar21->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar21->_M_string_length = 0;
      (pbVar21->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar13,-5,(string *)local_188);
      if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00b95ae6;
    }
    oVar16 = OutputTypeFromDestination((CTxDestination *)local_358);
    if (((ulong)oVar16.super__Optional_base<OutputType,_true,_true>._M_payload.
                super__Optional_payload_base<OutputType> & 0x1ffffffff) == 0x100000003) {
      pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
      local_188._0_8_ = local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,"Bech32m addresses cannot be imported into legacy wallets","");
      JSONRPCError(pUVar13,-5,(string *)local_188);
      if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00b95ae6;
    }
    GetScriptForDestination((CScript *)local_188,(CTxDestination *)local_358);
    if (0x1c < (uint)local_158._12_4_) {
      free((void *)local_168._0_8_);
    }
    local_158._0_4_ = local_178._0_4_;
    local_158._4_4_ = local_178._4_4_;
    local_158._8_4_ = local_178._8_4_;
    local_168._0_8_ = local_188._0_8_;
    local_168._8_4_ = local_188._8_4_;
    local_168._12_4_ = local_188._12_4_;
    local_158._12_4_ = local_178._12_4_;
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_358);
  }
  std::_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
  ::_M_emplace_unique<CScript&>
            ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
              *)script_pub_keys,(CScript *)local_168);
  if (local_78._M_string_length != 0) {
    str_00._M_str = local_78._M_dataplus._M_p;
    str_00._M_len = local_78._M_string_length;
    bVar11 = IsHex(str_00);
    if (!bVar11) {
      pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "Invalid redeem script \"",&local_78);
      pbVar21 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188,"\": must be hex string");
      local_358._0_8_ = (pbVar21->_M_dataplus)._M_p;
      paVar27 = &pbVar21->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar21->field_2 + 8);
        local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_348._8_4_ = (undefined4)uVar10;
        local_348._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_358._0_8_ = (CScript *)local_348;
      }
      else {
        local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_358._8_4_ = (undefined4)pbVar21->_M_string_length;
      local_358._12_4_ = (undefined4)(pbVar21->_M_string_length >> 0x20);
      (pbVar21->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar21->_M_string_length = 0;
      (pbVar21->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar13,-5,(string *)local_358);
      if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00b95ae6;
    }
    hex_str_00._M_str = local_78._M_dataplus._M_p;
    hex_str_00._M_len = local_78._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_358,hex_str_00);
    uVar10 = local_358._0_8_;
    last._M_current._4_4_ = local_358._12_4_;
    last._M_current._0_4_ = local_358._8_4_;
    _Var17._M_head_impl = (CScript *)operator_new(0x20);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)_Var17._M_head_impl,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )uVar10,last);
    local_188._0_8_ = (CScript *)0x0;
    _Var8._M_head_impl =
         (import_data->redeemscript)._M_t.
         super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
         super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
         super__Head_base<0UL,_CScript_*,_false>._M_head_impl;
    (import_data->redeemscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>.
    _M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
    super__Head_base<0UL,_CScript_*,_false>._M_head_impl = _Var17._M_head_impl;
    if ((_Var8._M_head_impl != (CScript *)0x0) &&
       (std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)import_data,_Var8._M_head_impl),
       (CScript *)local_188._0_8_ != (CScript *)0x0)) {
      std::default_delete<CScript>::operator()
                ((default_delete<CScript> *)local_188,(CScript *)local_188._0_8_);
    }
    if ((CScript *)local_358._0_8_ != (CScript *)0x0) {
      operator_delete((void *)local_358._0_8_,
                      CONCAT44(local_348._4_4_,local_348._0_4_) - local_358._0_8_);
    }
  }
  if (local_98._M_string_length != 0) {
    str_01._M_str = local_98._M_dataplus._M_p;
    str_01._M_len = local_98._M_string_length;
    bVar11 = IsHex(str_01);
    if (!bVar11) {
      pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "Invalid witness script \"",&local_98);
      pbVar21 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188,"\": must be hex string");
      local_358._0_8_ = (pbVar21->_M_dataplus)._M_p;
      paVar27 = &pbVar21->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar21->field_2 + 8);
        local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_348._8_4_ = (undefined4)uVar10;
        local_348._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_358._0_8_ = (CScript *)local_348;
      }
      else {
        local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_358._8_4_ = (undefined4)pbVar21->_M_string_length;
      local_358._12_4_ = (undefined4)(pbVar21->_M_string_length >> 0x20);
      (pbVar21->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar21->_M_string_length = 0;
      (pbVar21->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar13,-5,(string *)local_358);
      if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_00b95ae6;
    }
    hex_str_01._M_str = local_98._M_dataplus._M_p;
    hex_str_01._M_len = local_98._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_358,hex_str_01);
    uVar10 = local_358._0_8_;
    last_00._M_current._4_4_ = local_358._12_4_;
    last_00._M_current._0_4_ = local_358._8_4_;
    this_00 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)operator_new(0x20);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              (this_00,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )uVar10,last_00);
    local_188._0_8_ = (CScript *)0x0;
    pCVar9 = (import_data->witnessscript)._M_t.
             super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
             super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
             super__Head_base<0UL,_CScript_*,_false>._M_head_impl;
    (import_data->witnessscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>.
    _M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
    super__Head_base<0UL,_CScript_*,_false>._M_head_impl = (CScript *)this_00;
    if ((pCVar9 != (CScript *)0x0) &&
       (std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)&import_data->witnessscript,pCVar9),
       (CScript *)local_188._0_8_ != (CScript *)0x0)) {
      std::default_delete<CScript>::operator()
                ((default_delete<CScript> *)local_188,(CScript *)local_188._0_8_);
    }
    if ((CScript *)local_358._0_8_ != (CScript *)0x0) {
      operator_delete((void *)local_358._0_8_,
                      CONCAT44(local_348._4_4_,local_348._0_4_) - local_358._0_8_);
    }
  }
  if (vStack_b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vStack_b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar30 = 0;
    do {
      pUVar13 = ::UniValue::operator[]((UniValue *)local_f0,sVar30);
      psVar14 = ::UniValue::get_str_abi_cxx11_(pUVar13);
      HexToPubKey((CPubKey *)local_358,psVar14);
      CPubKey::GetID((CKeyID *)local_188,(CPubKey *)local_358);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
      ::_M_emplace_unique<CKeyID,CPubKey&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                  *)pubkey_map,(CKeyID *)local_188,(CPubKey *)local_358);
      CPubKey::GetID((CKeyID *)local_188,(CPubKey *)local_358);
      std::vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>>::
      emplace_back<CKeyID,bool_const&>
                ((vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>> *)
                 ordered_pubkeys,(CKeyID *)local_188,(bool *)&stack0xfffffffffffffb27);
      sVar30 = sVar30 + 1;
    } while (sVar30 < (ulong)(((long)vStack_b0.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)vStack_b0.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3));
  }
  script_ctx = (ScriptContext)psVar29;
  if (vStack_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vStack_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    p_Var1 = (_Base_ptr)((long)pubkey_map + 8);
    sVar30 = 0;
    do {
      pUVar13 = ::UniValue::operator[]((UniValue *)local_148,sVar30);
      ::UniValue::get_str_abi_cxx11_(pUVar13);
      DecodeSecret((string *)local_1a8);
      if ((array<unsigned_char,_32UL> *)local_1a0._M_current == (array<unsigned_char,_32UL> *)0x0) {
        pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
        local_358._0_8_ = local_348;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,"Invalid private key encoding","");
        JSONRPCError(pUVar13,-5,(string *)local_358);
        if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar13,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_00b95ae6;
      }
      CKey::GetPubKey((CPubKey *)local_358,(CKey *)local_1a8);
      CPubKey::GetID((CKeyID *)local_188,(CPubKey *)local_358);
      cVar18 = std::
               _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
               ::find(&pubkey_map->_M_t,(CKeyID *)local_188);
      if (cVar18._M_node != p_Var1) {
        pVar31 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                 ::equal_range(&pubkey_map->_M_t,(CKeyID *)local_188);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        ::_M_erase_aux(&pubkey_map->_M_t,(_Base_ptr)pVar31.first._M_node,
                       (_Base_ptr)pVar31.second._M_node);
      }
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
      ::_M_emplace_unique<CKeyID&,CKey&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                  *)privkey_map,(CKeyID *)local_188,(CKey *)local_1a8);
      if ((array<unsigned_char,_32UL> *)local_1a0._M_current != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1a0,
                   (array<unsigned_char,_32UL> *)local_1a0._M_current);
      }
      script_ctx = (ScriptContext)psVar29;
      sVar30 = sVar30 + 1;
    } while (sVar30 < (ulong)(((long)vStack_108.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)vStack_108.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3));
  }
  if ((((import_data->redeemscript)._M_t.
        super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
        super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
        super__Head_base<0UL,_CScript_*,_false>._M_head_impl == (CScript *)0x0) &&
      ((import_data->witnessscript)._M_t.
       super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
       super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
       super__Head_base<0UL,_CScript_*,_false>._M_head_impl == (CScript *)0x0)) &&
     (*(size_t *)((long)pubkey_map + 0x28) == 0)) {
    sVar30 = *(size_t *)((long)privkey_map + 0x28);
    *have_solving_data = sVar30 != 0;
    if (sVar30 != 0) goto LAB_00b9410a;
  }
  else {
    *have_solving_data = true;
LAB_00b9410a:
    this_01 = import_data;
    RecurseImportData_abi_cxx11_
              ((string *)local_188,(wallet *)local_168,(CScript *)import_data,(ImportData *)0x0,
               script_ctx);
    p_Var20 = (import_data->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(import_data->used_keys)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var20 == p_Var2) {
LAB_00b94191:
      bVar11 = (_Rb_tree_header *)p_Var20 == p_Var2;
      bVar26 = (byte)uVar32;
      if (bVar26 != 0 || bVar11) goto LAB_00b941a1;
      ::UniValue::UniValue<const_char_(&)[121],_char[121],_true>
                (&local_200,
                 (char (*) [121])
                 "Some private keys are missing, outputs will be considered watchonly. If this is intentional, specify the watchonly flag."
                );
      val_00.val._M_dataplus._M_p = (pointer)this_01;
      val_00._0_8_ = in_stack_fffffffffffffae8;
      val_00.val._M_string_length = (size_type)pubkey_map;
      val_00.val.field_2._M_allocated_capacity = (size_type)privkey_map;
      val_00.val.field_2._8_8_ = __return_storage_ptr__;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar32;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffb14;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffffb20;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (bool)cVar12;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb28._M_p;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb30;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb38;
      ::UniValue::push_back(__return_storage_ptr__,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_200.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_200.keys);
      pUVar13 = &local_200;
      local_258.val._M_dataplus._M_p = local_200.val._M_dataplus._M_p;
LAB_00b9424c:
      paVar27 = &(pUVar13->val).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258.val._M_dataplus._M_p != paVar27) {
        operator_delete(local_258.val._M_dataplus._M_p,paVar27->_M_allocated_capacity + 1);
      }
    }
    else {
      p_Var1 = (_Base_ptr)((long)privkey_map + 8);
      do {
        local_348._0_4_ = *(undefined4 *)&p_Var20[1]._M_left;
        local_358._0_8_ = *(undefined8 *)(p_Var20 + 1);
        local_358._8_4_ = SUB84(p_Var20[1]._M_parent,0);
        local_358._12_4_ = (undefined4)((ulong)p_Var20[1]._M_parent >> 0x20);
        local_348[4] = *(undefined1 *)((long)&p_Var20[1]._M_left + 4);
        cVar19 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                 ::find(&privkey_map->_M_t,(key_type *)local_358);
        if (cVar19._M_node == p_Var1) goto LAB_00b94191;
        p_Var20 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != p_Var2);
      bVar11 = true;
      bVar26 = (byte)uVar32;
LAB_00b941a1:
      if ((bVar26 & bVar11) == 1) {
        ::UniValue::UniValue<const_char_(&)[128],_char[128],_true>
                  (&local_258,
                   (char (*) [128])
                   "All private keys are provided, outputs will be considered spendable. If this is intentional, do not specify the watchonly flag."
                  );
        val.val._M_dataplus._M_p = (pointer)this_01;
        val._0_8_ = in_stack_fffffffffffffae8;
        val.val._M_string_length = (size_type)pubkey_map;
        val.val.field_2._M_allocated_capacity = (size_type)privkey_map;
        val.val.field_2._8_8_ = __return_storage_ptr__;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar32;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffb14;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffffb20;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (bool)cVar12;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb28._M_p;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb30;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb38;
        ::UniValue::push_back(__return_storage_ptr__,val);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_258.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_258.keys);
        pUVar13 = &local_258;
        goto LAB_00b9424c;
      }
    }
    this = &this_01->witnessscript;
    this_02 = &this_01->used_keys;
    if (CONCAT44(local_188._12_4_,local_188._8_4_) == 0) {
      p_Var20 = (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var20 != p_Var2) {
        p_Var1 = (_Base_ptr)((long)pubkey_map + 8);
        p_Var3 = (_Base_ptr)((long)privkey_map + 8);
        do {
          if (*(char *)((long)&p_Var20[1]._M_left + 4) == '\x01') {
            cVar18 = std::
                     _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                     ::find(&pubkey_map->_M_t,(key_type *)(p_Var20 + 1));
            if ((cVar18._M_node == p_Var1) &&
               (cVar19 = std::
                         _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                         ::find(&privkey_map->_M_t,(key_type *)(p_Var20 + 1)),
               cVar19._M_node == p_Var3)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_188,0,CONCAT44(local_188._12_4_,local_188._8_4_),
                         "some required keys are missing",0x1e);
            }
          }
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
        } while ((_Rb_tree_header *)p_Var20 != p_Var2);
        if (CONCAT44(local_188._12_4_,local_188._8_4_) != 0) goto LAB_00b94279;
      }
      if ((this_01->redeemscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>
          ._M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
          super__Head_base<0UL,_CScript_*,_false>._M_head_impl != (CScript *)0x0) {
        ::UniValue::UniValue<const_char_(&)[52],_char[52],_true>
                  (&local_3b0,(char (*) [52])"Ignoring redeemscript as this is not a P2SH script.");
        val_01.val._M_dataplus._M_p = (pointer)this_01;
        val_01._0_8_ = in_stack_fffffffffffffae8;
        val_01.val._M_string_length = (size_type)pubkey_map;
        val_01.val.field_2._M_allocated_capacity = (size_type)privkey_map;
        val_01.val.field_2._8_8_ = __return_storage_ptr__;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffffb20;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (bool)cVar12;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb28._M_p;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb30;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb38;
        ::UniValue::push_back(__return_storage_ptr__,val_01);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3b0.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3b0.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0.val._M_dataplus._M_p != &local_3b0.val.field_2) {
          operator_delete(local_3b0.val._M_dataplus._M_p,
                          local_3b0.val.field_2._M_allocated_capacity + 1);
        }
      }
      if ((this->_M_t).super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
          super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
          super__Head_base<0UL,_CScript_*,_false>._M_head_impl != (CScript *)0x0) {
        ::UniValue::UniValue<const_char_(&)[61],_char[61],_true>
                  (&local_408,
                   (char (*) [61])"Ignoring witnessscript as this is not a (P2SH-)P2WSH script.");
        val_02.val._M_dataplus._M_p = (pointer)this_01;
        val_02._0_8_ = in_stack_fffffffffffffae8;
        val_02.val._M_string_length = (size_type)pubkey_map;
        val_02.val.field_2._M_allocated_capacity = (size_type)privkey_map;
        val_02.val.field_2._8_8_ = __return_storage_ptr__;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffffb20;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (bool)cVar12;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb28._M_p;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb30;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb38;
        ::UniValue::push_back(__return_storage_ptr__,val_02);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_408.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_408.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408.val._M_dataplus._M_p != &local_408.val.field_2) {
          operator_delete(local_408.val._M_dataplus._M_p,
                          local_408.val.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var20 = (_Base_ptr)((long)privkey_map + 8);
      if (*(_Base_ptr *)((long)privkey_map + 0x18) != p_Var20) {
        __position_00._M_node = *(_Base_ptr *)((long)privkey_map + 0x18);
        do {
          p_Var22 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)__position_00._M_node);
          cVar23 = std::
                   _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                   ::find(&this_02->_M_t,__position_00._M_node + 1);
          if ((_Rb_tree_header *)cVar23._M_node == p_Var2) {
            ::UniValue::UniValue<const_char_(&)[33],_char[33],_true>
                      (&local_460,(char (*) [33])"Ignoring irrelevant private key.");
            val_03.val._M_dataplus._M_p = (pointer)this_01;
            val_03._0_8_ = in_stack_fffffffffffffae8;
            val_03.val._M_string_length = (size_type)pubkey_map;
            val_03.val.field_2._M_allocated_capacity = (size_type)privkey_map;
            val_03.val.field_2._8_8_ = __return_storage_ptr__;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffffb20;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (bool)cVar12;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb28._M_p;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb30;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb38;
            ::UniValue::push_back(__return_storage_ptr__,val_03);
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_460.values);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_460.keys);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460.val._M_dataplus._M_p != &local_460.val.field_2) {
              operator_delete(local_460.val._M_dataplus._M_p,
                              local_460.val.field_2._M_allocated_capacity + 1);
            }
            std::
            _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
            ::erase_abi_cxx11_((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                                *)privkey_map,__position_00);
          }
          __position_00._M_node = p_Var22;
        } while (p_Var22 != p_Var20);
      }
      p_Var1 = (_Base_ptr)((long)pubkey_map + 8);
      iVar24._M_node = *(_Base_ptr *)((long)pubkey_map + 0x18);
      while (__position._M_node = iVar24._M_node, __position._M_node != p_Var1) {
        iVar24._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        iVar25 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                 ::find(&this_02->_M_t,__position._M_node + 1);
        if (((_Rb_tree_header *)iVar25._M_node == p_Var2) ||
           (*(char *)((long)&iVar25._M_node[1]._M_left + 4) == '\0')) {
          s.m_size = 0x14;
          s.m_data = (uchar *)(__position._M_node + 1);
          HexStr_abi_cxx11_((string *)&stack0xfffffffffffffb28,s);
          pbVar21 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((string *)&stack0xfffffffffffffb28,0,0,"Ignoring public key \"",0x15);
          local_1a8 = (undefined1  [8])&local_198;
          paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar21->_M_dataplus)._M_p;
          paVar28 = &pbVar21->field_2;
          if (paVar27 == paVar28) {
            local_198._M_allocated_capacity = paVar28->_M_allocated_capacity;
            local_198._8_8_ = *(undefined8 *)((long)&pbVar21->field_2 + 8);
          }
          else {
            local_198._M_allocated_capacity = paVar28->_M_allocated_capacity;
            local_1a8 = (undefined1  [8])paVar27;
          }
          local_1a0._M_current = (uchar *)pbVar21->_M_string_length;
          (pbVar21->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar21->_M_string_length = 0;
          (pbVar21->field_2)._M_local_buf[0] = '\0';
          pbVar21 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8,"\" as it doesn\'t appear inside P2PKH or P2WPKH.");
          local_358._0_8_ = local_348;
          pCVar9 = (CScript *)(pbVar21->_M_dataplus)._M_p;
          paVar27 = &pbVar21->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pCVar9 == paVar27) {
            uVar10 = *(undefined8 *)((long)&pbVar21->field_2 + 8);
            local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
            local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
            local_348._8_4_ = (undefined4)uVar10;
            local_348._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
          }
          else {
            local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
            local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
            local_358._0_8_ = pCVar9;
          }
          local_358._8_4_ = (undefined4)pbVar21->_M_string_length;
          local_358._12_4_ = (undefined4)(pbVar21->_M_string_length >> 0x20);
          (pbVar21->_M_dataplus)._M_p = (pointer)paVar27;
          pbVar21->_M_string_length = 0;
          (pbVar21->field_2)._M_local_buf[0] = '\0';
          ::UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_4b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358)
          ;
          val_04.val._M_dataplus._M_p = (pointer)this_01;
          val_04._0_8_ = in_stack_fffffffffffffae8;
          val_04.val._M_string_length = (size_type)pubkey_map;
          val_04.val.field_2._M_allocated_capacity = (size_type)privkey_map;
          val_04.val.field_2._8_8_ = __return_storage_ptr__;
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffffb20;
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (bool)cVar12;
          val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb28._M_p;
          val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb30;
          val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb38;
          ::UniValue::push_back(__return_storage_ptr__,val_04);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4b8.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_4b8.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8.val._M_dataplus._M_p != &local_4b8.val.field_2) {
            operator_delete(local_4b8.val._M_dataplus._M_p,
                            local_4b8.val.field_2._M_allocated_capacity + 1);
          }
          if ((CScript *)local_358._0_8_ != (CScript *)local_348) {
            operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
          }
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8,(ulong)(local_198._M_allocated_capacity + 1));
          }
          if (in_stack_fffffffffffffb28._M_p != &stack0xfffffffffffffb38) {
            operator_delete(in_stack_fffffffffffffb28._M_p,(ulong)(in_stack_fffffffffffffb38 + 1));
          }
          std::
          _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
          ::erase_abi_cxx11_((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                              *)pubkey_map,__position);
        }
      }
    }
    else {
LAB_00b94279:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Importing as non-solvable: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188)
      ;
      pbVar21 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,
                       ". If this is intentional, don\'t provide any keys, pubkeys, witnessscript, or redeemscript."
                      );
      local_358._0_8_ = local_348;
      pcVar7 = (pbVar21->_M_dataplus)._M_p;
      paVar27 = &pbVar21->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7 == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar21->field_2 + 8);
        local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_348._8_4_ = (undefined4)uVar10;
        local_348._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      }
      else {
        local_348._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_348._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_358._0_8_ = pcVar7;
      }
      local_358._8_4_ = (undefined4)pbVar21->_M_string_length;
      local_358._12_4_ = (undefined4)(pbVar21->_M_string_length >> 0x20);
      (pbVar21->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar21->_M_string_length = 0;
      (pbVar21->field_2)._M_local_buf[0] = '\0';
      ::UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_2b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
      val_05.val._M_dataplus._M_p = (pointer)this_01;
      val_05._0_8_ = in_stack_fffffffffffffae8;
      val_05.val._M_string_length = (size_type)pubkey_map;
      val_05.val.field_2._M_allocated_capacity = (size_type)privkey_map;
      val_05.val.field_2._8_8_ = __return_storage_ptr__;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffffb20;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (bool)cVar12;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb28._M_p;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb30;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb38;
      ::UniValue::push_back(__return_storage_ptr__,val_05);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2b0.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2b0.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.val._M_dataplus._M_p != &local_2b0.val.field_2) {
        operator_delete(local_2b0.val._M_dataplus._M_p,
                        local_2b0.val.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_358._0_8_ != local_348) {
        operator_delete((void *)local_358._0_8_,CONCAT44(local_348._4_4_,local_348._0_4_) + 1);
      }
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,(ulong)(local_198._M_allocated_capacity + 1));
      }
      p_Var20 = (_Base_ptr)(local_348 + 8);
      _Stack_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_318._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_2e8._M_impl._0_8_ = 0;
      local_348._40_8_ = 0;
      _Stack_318._M_impl._0_8_ = 0;
      local_348._8_4_ = _S_red;
      local_348._12_4_ = 0;
      local_348._16_8_ = (_Base_ptr)0x0;
      local_358._8_4_ = 0;
      local_358._12_4_ = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      p_Var4 = &_Stack_318._M_impl.super__Rb_tree_header;
      _Var17._M_head_impl = (CScript *)0x0;
      _Stack_318._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      p_Var5 = &_Stack_2e8._M_impl.super__Rb_tree_header;
      _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_2e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_358._0_8_ = (CScript *)0x0;
      _Var8._M_head_impl =
           (this_01->redeemscript)._M_t.
           super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
           super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
           super__Head_base<0UL,_CScript_*,_false>._M_head_impl;
      (this_01->redeemscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>.
      _M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
      super__Head_base<0UL,_CScript_*,_false>._M_head_impl = (CScript *)0x0;
      local_348._24_8_ = p_Var20;
      local_348._32_8_ = p_Var20;
      _Stack_318._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
      _Stack_318._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
      _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
      _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
      if (_Var8._M_head_impl != (CScript *)0x0) {
        std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)this_01,_Var8._M_head_impl);
        _Var17._M_head_impl = (CScript *)CONCAT44(local_358._12_4_,local_358._8_4_);
      }
      local_358._8_4_ = 0;
      local_358._12_4_ = 0;
      _Var8._M_head_impl =
           (this->_M_t).super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
           super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
           super__Head_base<0UL,_CScript_*,_false>._M_head_impl;
      (this->_M_t).super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
      super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
      super__Head_base<0UL,_CScript_*,_false>._M_head_impl = _Var17._M_head_impl;
      if (_Var8._M_head_impl != (CScript *)0x0) {
        std::default_delete<CScript>::operator()((default_delete<CScript> *)this,_Var8._M_head_impl)
        ;
      }
      std::
      _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
      ::clear(&(this_01->import_scripts)._M_t);
      if ((_Base_ptr)local_348._16_8_ != (_Base_ptr)0x0) {
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_348._8_4_;
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_348._16_8_;
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)local_348._24_8_;
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)local_348._32_8_;
        *(_Rb_tree_header **)(local_348._16_8_ + 8) =
             &(this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header;
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_348._40_8_;
        local_348._16_8_ = (_Base_ptr)0x0;
        local_348._40_8_ = 0;
        local_348._24_8_ = p_Var20;
        local_348._32_8_ = p_Var20;
      }
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
      ::clear(&this_02->_M_t);
      if (_Stack_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _Stack_318._M_impl.super__Rb_tree_header._M_header._M_color;
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             _Stack_318._M_impl.super__Rb_tree_header._M_header._M_parent;
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             _Stack_318._M_impl.super__Rb_tree_header._M_header._M_left;
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_318._M_impl.super__Rb_tree_header._M_header._M_right;
        (_Stack_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var2->_M_header;
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             _Stack_318._M_impl.super__Rb_tree_header._M_node_count;
        _Stack_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_318._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_318._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
        _Stack_318._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
      }
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::clear(&(this_01->key_origins)._M_t);
      if (_Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_color;
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_parent;
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_right;
        (_Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &(this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header;
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             _Stack_2e8._M_impl.super__Rb_tree_header._M_node_count;
        _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
        _Stack_2e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
      }
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::~_Rb_tree(&_Stack_2e8);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
      ::~_Rb_tree(&_Stack_318);
      std::
      _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
      ::~_Rb_tree((_Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
                   *)local_348);
      if ((CScript *)CONCAT44(local_358._12_4_,local_358._8_4_) != (CScript *)0x0) {
        std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)(local_358 + 8),
                   (CScript *)CONCAT44(local_358._12_4_,local_358._8_4_));
      }
      local_358._8_4_ = 0;
      local_358._12_4_ = 0;
      if ((CScript *)local_358._0_8_ != (CScript *)0x0) {
        std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)local_358,(CScript *)local_358._0_8_);
      }
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::clear(&pubkey_map->_M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::clear(&privkey_map->_M_t);
      *have_solving_data = false;
    }
    if ((CScript *)local_188._0_8_ != (CScript *)local_178) {
      operator_delete((void *)local_188._0_8_,CONCAT44(local_178._4_4_,local_178._0_4_) + 1);
    }
  }
  if (0x1c < (uint)local_158._12_4_) {
    free((void *)local_168._0_8_);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  if (local_140._M_p != local_138 + 8) {
    operator_delete(local_140._M_p,CONCAT71(local_138._9_7_,local_138[8]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  if (local_e8._M_p != local_e0 + 8) {
    operator_delete(local_e8._M_p,CONCAT71(local_e0._9_7_,local_e0[8]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(UniValue **)(in_FS_OFFSET + 0x28);
  }
LAB_00b95ae6:
  __stack_chk_fail();
}

Assistant:

static UniValue ProcessImportLegacy(ImportData& import_data, std::map<CKeyID, CPubKey>& pubkey_map, std::map<CKeyID, CKey>& privkey_map, std::set<CScript>& script_pub_keys, bool& have_solving_data, const UniValue& data, std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys)
{
    UniValue warnings(UniValue::VARR);

    // First ensure scriptPubKey has either a script or JSON with "address" string
    const UniValue& scriptPubKey = data["scriptPubKey"];
    bool isScript = scriptPubKey.getType() == UniValue::VSTR;
    if (!isScript && !(scriptPubKey.getType() == UniValue::VOBJ && scriptPubKey.exists("address"))) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "scriptPubKey must be string with script or JSON with address string");
    }
    const std::string& output = isScript ? scriptPubKey.get_str() : scriptPubKey["address"].get_str();

    // Optional fields.
    const std::string& strRedeemScript = data.exists("redeemscript") ? data["redeemscript"].get_str() : "";
    const std::string& witness_script_hex = data.exists("witnessscript") ? data["witnessscript"].get_str() : "";
    const UniValue& pubKeys = data.exists("pubkeys") ? data["pubkeys"].get_array() : UniValue();
    const UniValue& keys = data.exists("keys") ? data["keys"].get_array() : UniValue();
    const bool internal = data.exists("internal") ? data["internal"].get_bool() : false;
    const bool watchOnly = data.exists("watchonly") ? data["watchonly"].get_bool() : false;

    if (data.exists("range")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Range should not be specified for a non-descriptor import");
    }

    // Generate the script and destination for the scriptPubKey provided
    CScript script;
    if (!isScript) {
        CTxDestination dest = DecodeDestination(output);
        if (!IsValidDestination(dest)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address \"" + output + "\"");
        }
        if (OutputTypeFromDestination(dest) == OutputType::BECH32M) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Bech32m addresses cannot be imported into legacy wallets");
        }
        script = GetScriptForDestination(dest);
    } else {
        if (!IsHex(output)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid scriptPubKey \"" + output + "\"");
        }
        std::vector<unsigned char> vData(ParseHex(output));
        script = CScript(vData.begin(), vData.end());
        CTxDestination dest;
        if (!ExtractDestination(script, dest) && !internal) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Internal must be set to true for nonstandard scriptPubKey imports.");
        }
    }
    script_pub_keys.emplace(script);

    // Parse all arguments
    if (strRedeemScript.size()) {
        if (!IsHex(strRedeemScript)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid redeem script \"" + strRedeemScript + "\": must be hex string");
        }
        auto parsed_redeemscript = ParseHex(strRedeemScript);
        import_data.redeemscript = std::make_unique<CScript>(parsed_redeemscript.begin(), parsed_redeemscript.end());
    }
    if (witness_script_hex.size()) {
        if (!IsHex(witness_script_hex)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid witness script \"" + witness_script_hex + "\": must be hex string");
        }
        auto parsed_witnessscript = ParseHex(witness_script_hex);
        import_data.witnessscript = std::make_unique<CScript>(parsed_witnessscript.begin(), parsed_witnessscript.end());
    }
    for (size_t i = 0; i < pubKeys.size(); ++i) {
        CPubKey pubkey = HexToPubKey(pubKeys[i].get_str());
        pubkey_map.emplace(pubkey.GetID(), pubkey);
        ordered_pubkeys.emplace_back(pubkey.GetID(), internal);
    }
    for (size_t i = 0; i < keys.size(); ++i) {
        const auto& str = keys[i].get_str();
        CKey key = DecodeSecret(str);
        if (!key.IsValid()) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key encoding");
        }
        CPubKey pubkey = key.GetPubKey();
        CKeyID id = pubkey.GetID();
        if (pubkey_map.count(id)) {
            pubkey_map.erase(id);
        }
        privkey_map.emplace(id, key);
    }


    // Verify and process input data
    have_solving_data = import_data.redeemscript || import_data.witnessscript || pubkey_map.size() || privkey_map.size();
    if (have_solving_data) {
        // Match up data in import_data with the scriptPubKey in script.
        auto error = RecurseImportData(script, import_data, ScriptContext::TOP);

        // Verify whether the watchonly option corresponds to the availability of private keys.
        bool spendable = std::all_of(import_data.used_keys.begin(), import_data.used_keys.end(), [&](const std::pair<CKeyID, bool>& used_key){ return privkey_map.count(used_key.first) > 0; });
        if (!watchOnly && !spendable) {
            warnings.push_back("Some private keys are missing, outputs will be considered watchonly. If this is intentional, specify the watchonly flag.");
        }
        if (watchOnly && spendable) {
            warnings.push_back("All private keys are provided, outputs will be considered spendable. If this is intentional, do not specify the watchonly flag.");
        }

        // Check that all required keys for solvability are provided.
        if (error.empty()) {
            for (const auto& require_key : import_data.used_keys) {
                if (!require_key.second) continue; // Not a required key
                if (pubkey_map.count(require_key.first) == 0 && privkey_map.count(require_key.first) == 0) {
                    error = "some required keys are missing";
                }
            }
        }

        if (!error.empty()) {
            warnings.push_back("Importing as non-solvable: " + error + ". If this is intentional, don't provide any keys, pubkeys, witnessscript, or redeemscript.");
            import_data = ImportData();
            pubkey_map.clear();
            privkey_map.clear();
            have_solving_data = false;
        } else {
            // RecurseImportData() removes any relevant redeemscript/witnessscript from import_data, so we can use that to discover if a superfluous one was provided.
            if (import_data.redeemscript) warnings.push_back("Ignoring redeemscript as this is not a P2SH script.");
            if (import_data.witnessscript) warnings.push_back("Ignoring witnessscript as this is not a (P2SH-)P2WSH script.");
            for (auto it = privkey_map.begin(); it != privkey_map.end(); ) {
                auto oldit = it++;
                if (import_data.used_keys.count(oldit->first) == 0) {
                    warnings.push_back("Ignoring irrelevant private key.");
                    privkey_map.erase(oldit);
                }
            }
            for (auto it = pubkey_map.begin(); it != pubkey_map.end(); ) {
                auto oldit = it++;
                auto key_data_it = import_data.used_keys.find(oldit->first);
                if (key_data_it == import_data.used_keys.end() || !key_data_it->second) {
                    warnings.push_back("Ignoring public key \"" + HexStr(oldit->first) + "\" as it doesn't appear inside P2PKH or P2WPKH.");
                    pubkey_map.erase(oldit);
                }
            }
        }
    }

    return warnings;
}